

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler.h
# Opt level: O0

bool __thiscall
parlay::scheduler<parlay::WorkStealingJob>::finished(scheduler<parlay::WorkStealingJob> *this)

{
  long in_RDI;
  memory_order __b;
  
  std::operator&(memory_order_acquire,__memory_order_mask);
  return *(int *)(in_RDI + 0x68) != 0;
}

Assistant:

bool finished() const noexcept {
    return finished_flag.load(std::memory_order_acquire);
  }